

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

matrix4 * matrix4_multiply(matrix4 *self,matrix4 *mT)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  anon_union_128_5_d0a4420b_for_matrix4_0 local_88;
  
  dVar1 = (mT->field_0).m[0];
  dVar2 = (mT->field_0).m[1];
  dVar3 = (mT->field_0).m[2];
  dVar4 = (mT->field_0).m[3];
  dVar5 = (self->field_0).m[0];
  dVar6 = (self->field_0).m[1];
  dVar7 = (self->field_0).m[4];
  dVar8 = (self->field_0).m[5];
  dVar9 = (self->field_0).m[8];
  dVar10 = (self->field_0).m[9];
  dVar11 = (self->field_0).m[0xc];
  dVar12 = (self->field_0).m[0xd];
  local_88.m[0] = dVar11 * dVar4 + dVar9 * dVar3 + dVar5 * dVar1 + dVar2 * dVar7;
  local_88.m[1] = dVar12 * dVar4 + dVar10 * dVar3 + dVar6 * dVar1 + dVar2 * dVar8;
  dVar13 = (self->field_0).m[2];
  dVar14 = (self->field_0).m[3];
  dVar15 = (self->field_0).m[6];
  dVar16 = (self->field_0).m[7];
  dVar17 = (self->field_0).m[10];
  dVar18 = (self->field_0).m[0xb];
  dVar19 = (self->field_0).m[0xe];
  dVar20 = (self->field_0).m[0xf];
  local_88.m[2] = dVar4 * dVar19 + dVar3 * dVar17 + dVar1 * dVar13 + dVar2 * dVar15;
  local_88.m[3] = dVar4 * dVar20 + dVar3 * dVar18 + dVar1 * dVar14 + dVar2 * dVar16;
  dVar1 = (mT->field_0).m[4];
  dVar2 = (mT->field_0).m[5];
  dVar3 = (mT->field_0).m[6];
  dVar4 = (mT->field_0).m[7];
  local_88.m[4] = dVar11 * dVar4 + dVar9 * dVar3 + dVar5 * dVar1 + dVar7 * dVar2;
  local_88.m[5] = dVar12 * dVar4 + dVar10 * dVar3 + dVar6 * dVar1 + dVar8 * dVar2;
  local_88.m[6] = dVar4 * dVar19 + dVar3 * dVar17 + dVar1 * dVar13 + dVar2 * dVar15;
  local_88.m[7] = dVar4 * dVar20 + dVar3 * dVar18 + dVar1 * dVar14 + dVar2 * dVar16;
  dVar1 = (mT->field_0).m[8];
  dVar2 = (mT->field_0).m[9];
  dVar3 = (mT->field_0).m[10];
  dVar4 = (mT->field_0).m[0xb];
  local_88.m[8] = dVar11 * dVar4 + dVar9 * dVar3 + dVar5 * dVar1 + dVar7 * dVar2;
  local_88.m[9] = dVar12 * dVar4 + dVar10 * dVar3 + dVar6 * dVar1 + dVar8 * dVar2;
  local_88.m[10] = dVar4 * dVar19 + dVar3 * dVar17 + dVar1 * dVar13 + dVar2 * dVar15;
  local_88.m[0xb] = dVar4 * dVar20 + dVar3 * dVar18 + dVar1 * dVar14 + dVar2 * dVar16;
  dVar1 = (mT->field_0).m[0xc];
  dVar2 = (mT->field_0).m[0xd];
  dVar3 = (mT->field_0).m[0xe];
  dVar4 = (mT->field_0).m[0xf];
  local_88.m[0xc] = dVar11 * dVar4 + dVar9 * dVar3 + dVar5 * dVar1 + dVar7 * dVar2;
  local_88.m[0xd] = dVar12 * dVar4 + dVar10 * dVar3 + dVar6 * dVar1 + dVar8 * dVar2;
  local_88.m[0xe] = dVar4 * dVar19 + dVar3 * dVar17 + dVar1 * dVar13 + dVar2 * dVar15;
  local_88.m[0xf] = dVar4 * dVar20 + dVar3 * dVar18 + dVar1 * dVar14 + dVar2 * dVar16;
  matrix4_set(self,(matrix4 *)&local_88.field_1);
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_multiply(struct matrix4 *self, const struct matrix4 *mT)
{
	/* mT is the multiplicand */

	struct matrix4 r;

	matrix4_identity(&r);

	/* first row */
	r.r00 = self->c00 * mT->c00 + self->c01 * mT->c10 + self->c02 * mT->c20 + self->c03 * mT->c30;
	r.r01 = self->c10 * mT->c00 + self->c11 * mT->c10 + self->c12 * mT->c20 + self->c13 * mT->c30;
	r.r02 = self->c20 * mT->c00 + self->c21 * mT->c10 + self->c22 * mT->c20 + self->c23 * mT->c30;
	r.r03 = self->c30 * mT->c00 + self->c31 * mT->c10 + self->c32 * mT->c20 + self->c33 * mT->c30;

	/* second row */
	r.r10 = self->c00 * mT->c01 + self->c01 * mT->c11 + self->c02 * mT->c21 + self->c03 * mT->c31;
	r.r11 = self->c10 * mT->c01 + self->c11 * mT->c11 + self->c12 * mT->c21 + self->c13 * mT->c31;
	r.r12 = self->c20 * mT->c01 + self->c21 * mT->c11 + self->c22 * mT->c21 + self->c23 * mT->c31;
	r.r13 = self->c30 * mT->c01 + self->c31 * mT->c11 + self->c32 * mT->c21 + self->c33 * mT->c31;

	/* third row */
	r.r20 = self->c00 * mT->c02 + self->c01 * mT->c12 + self->c02 * mT->c22 + self->c03 * mT->c32;
	r.r21 = self->c10 * mT->c02 + self->c11 * mT->c12 + self->c12 * mT->c22 + self->c13 * mT->c32;
	r.r22 = self->c20 * mT->c02 + self->c21 * mT->c12 + self->c22 * mT->c22 + self->c23 * mT->c32;
	r.r23 = self->c30 * mT->c02 + self->c31 * mT->c12 + self->c32 * mT->c22 + self->c33 * mT->c32;

	/* fourth row */
	r.r30 = self->c00 * mT->c03 + self->c01 * mT->c13 + self->c02 * mT->c23 + self->c03 * mT->c33;
	r.r31 = self->c10 * mT->c03 + self->c11 * mT->c13 + self->c12 * mT->c23 + self->c13 * mT->c33;
	r.r32 = self->c20 * mT->c03 + self->c21 * mT->c13 + self->c22 * mT->c23 + self->c23 * mT->c33;
	r.r33 = self->c30 * mT->c03 + self->c31 * mT->c13 + self->c32 * mT->c23 + self->c33 * mT->c33;

	matrix4_set(self, &r); /* overwrite/save it */

	return self;
}